

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::CurrentTime
          (string *__return_storage_ptr__,cmTimestamp *this,string *formatString,bool utcFlag)

{
  time_t timeT;
  string local_50;
  time_t local_30;
  time_t currentTimeT;
  string *psStack_20;
  bool utcFlag_local;
  string *formatString_local;
  cmTimestamp *this_local;
  
  currentTimeT._7_1_ = utcFlag;
  psStack_20 = formatString;
  formatString_local = (string *)this;
  this_local = (cmTimestamp *)__return_storage_ptr__;
  timeT = time((time_t *)0x0);
  local_30 = timeT;
  if (timeT == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)psStack_20);
    CreateTimestampFromTimeT
              (__return_storage_ptr__,this,timeT,&local_50,(bool)(currentTimeT._7_1_ & 1));
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CurrentTime(
  const std::string& formatString, bool utcFlag)
{
  time_t currentTimeT = time(0);
  if(currentTimeT == time_t(-1))
    {
    return std::string();
    }

  return CreateTimestampFromTimeT(currentTimeT, formatString, utcFlag);
}